

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.cpp
# Opt level: O1

istream * embree::operator>>(istream *cin,Ref<embree::XML> *xml)

{
  StdStream *this;
  Ref<embree::Stream<int>_> local_80;
  XML *local_78;
  string local_70;
  string local_50;
  
  this = (StdStream *)operator_new(0x70);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"std::stream","");
  StdStream::StdStream(this,cin,&local_50);
  local_80.ptr = (Stream<int> *)this;
  (*(this->super_Stream<int>).super_RefCount._vptr_RefCount[2])(this);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  parseXML((embree *)&local_78,&local_80,&local_70,false,true);
  if (xml->ptr != (XML *)0x0) {
    (*(xml->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  xml->ptr = local_78;
  local_78 = (XML *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((StdStream *)local_80.ptr != (StdStream *)0x0) {
    (*(((Stream<int> *)&(local_80.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return cin;
}

Assistant:

std::istream& operator>>(std::istream& cin, Ref<XML>& xml) {
    xml = parseXML(new StdStream(cin),"",false,true);
    return cin;
  }